

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O3

TPZTransform<double> *
pztopology::TPZLine::SideToSideTransform
          (TPZTransform<double> *__return_storage_ptr__,int sidefrom,int sideto)

{
  ostream *poVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  int dim;
  char *pcVar5;
  ulong uVar6;
  char local_22;
  char local_21;
  
  if ((uint)sidefrom < 3 && (uint)sideto < 3) {
    lVar3 = (long)sidefrom;
    if (sidefrom == sideto) {
      dim = (&DAT_0150b40c)[lVar3];
      goto LAB_00dacb7a;
    }
    if (sidefrom == 2) {
      TransformElementToSide(__return_storage_ptr__,sideto);
      return __return_storage_ptr__;
    }
    if (sideto == 2) {
      TransformSideToElement(__return_storage_ptr__,sidefrom);
      return __return_storage_ptr__;
    }
    uVar4 = 1;
    if (1 < (int)*(uint *)(nhighdimsides + lVar3 * 4)) {
      uVar4 = (ulong)*(uint *)(nhighdimsides + lVar3 * 4);
    }
    uVar6 = 0;
    do {
      if (*(int *)(pztopology::highsides + lVar3 * 4 + uVar6 * 4) == sideto) {
        TPZTransform<double>::TPZTransform
                  (__return_storage_ptr__,(&DAT_0150b40c)[sideto],(&DAT_0150b40c)[lVar3]);
        return __return_storage_ptr__;
      }
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZLine::SideToSideTransform highside not found sidefrom ",
               0x39);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,sidefrom);
    pcVar5 = &local_21;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZLine::HigherDimensionSides sidefrom ",0x27);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,sidefrom);
    pcVar5 = &local_22;
  }
  *pcVar5 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,1);
  plVar2 = (long *)std::ostream::operator<<(poVar1,sideto);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  dim = 0;
LAB_00dacb7a:
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,dim);
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<> TPZLine::SideToSideTransform(int sidefrom, int sideto)
	{
		if(sidefrom <0 || sidefrom >= NSides || sideto <0 || sideto >= NSides) {
			PZError << "TPZLine::HigherDimensionSides sidefrom "<< sidefrom << 
			' ' << sideto << endl;
			return TPZTransform<>(0);
		}
		if(sidefrom == sideto) {
			return TPZTransform<>(sidedimension[sidefrom]);
		}
		if(sidefrom == NSides-1) {
			return TransformElementToSide(sideto);
		}
        
        if (sideto == NSides -1) {
            return TransformSideToElement(sidefrom);
        }
        
		int nhigh = nhighdimsides[sidefrom];
		int is;
		for(is=0; is<nhigh; is++) {
			if(highsides[sidefrom][is] == sideto) {
				int dfr = sidedimension[sidefrom];
				int dto = sidedimension[sideto];
				TPZTransform<> trans(dto,dfr);
				int i,j;
				for(i=0; i<dto; i++) {
					for(j=0; j<dfr; j++) {
						trans.Mult()(i,j) = sidetosidetransforms[sidefrom][is][j][i];
					}
					trans.Sum()(i,0) = sidetosidetransforms[sidefrom][is][3][i];
				}
				return trans;
			}
		}
		PZError << "TPZLine::SideToSideTransform highside not found sidefrom "
		<< sidefrom << ' ' << sideto << endl;
		return TPZTransform<>(0);
	}